

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  int iVar1;
  float_specs fVar2;
  long lVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  appender aVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char cVar13;
  sign_t sVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_8_dbbf3351 write;
  digit_grouping<char> grouping;
  undefined1 local_ff [2];
  undefined8 local_fd;
  int local_ec;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_e8;
  float_specs local_e0;
  int local_d4;
  undefined1 local_d0 [20];
  undefined1 auStack_bc [20];
  float_specs *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_90;
  void *local_88;
  format_specs<char> *local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  fVar2 = (float_specs)f->significand;
  lVar3 = 0x3f;
  if (((ulong)fVar2 | 1) != 0) {
    for (; ((ulong)fVar2 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  iVar18 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] -
           (uint)((ulong)fVar2 <
                 (ulong)*(float_specs *)
                         (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                         (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] * 8));
  local_fd._0_1_ = '0';
  sVar14 = fspecs._5_1_;
  local_ff[1] = sVar14;
  local_ec = iVar18;
  local_e0 = fVar2;
  local_78 = fspecs;
  if (-1 < iVar18) {
    uVar11 = ZEXT48((iVar18 + 1) - (uint)(sVar14 == none));
    local_ff[0] = '.';
    uVar10 = fspecs._4_4_;
    bVar4.container = (buffer<char> *)fspecs;
    if ((uVar10 >> 0x11 & 1) != 0) {
      unique0x1000051b = uVar11;
      local_e8.container = (buffer<char> *)fspecs;
      local_88 = loc.locale_;
      local_80 = specs;
      local_ff[0] = decimal_point_impl<char>(loc);
      specs = local_80;
      loc.locale_ = local_88;
      uVar11 = stack0xffffffffffffff08;
      bVar4.container = local_e8.container;
    }
    uVar12 = auStack_bc._4_8_;
    iVar15 = f->exponent;
    iVar1 = iVar18 + iVar15;
    iVar16 = (int)bVar4.container;
    if (fspecs._4_1_ == '\x01') {
LAB_0010b518:
      iVar15 = iVar18 + iVar15 + -1;
      if ((uVar10 >> 0x13 & 1) == 0) {
        iVar9 = 0;
        if (iVar18 == 1) {
          local_ff[0] = '\0';
          iVar9 = 0;
        }
      }
      else {
        iVar9 = 0;
        if (0 < iVar16 - iVar18) {
          iVar9 = iVar16 - iVar18;
        }
        uVar11 = ZEXT48((uint)((int)uVar11 + iVar9));
      }
      local_d0[0] = sVar14;
      auStack_bc[0] = local_ff[0];
      local_d0._16_4_ = iVar18;
      auStack_bc._4_5_ = CONCAT14('0',iVar9);
      auStack_bc._10_2_ = SUB82(uVar12,6);
      auStack_bc._4_8_ =
           CONCAT26(auStack_bc._10_2_,CONCAT15(((uVar10 >> 0x10 & 1) == 0) << 5,auStack_bc._4_5_)) |
           0x450000000000;
      auStack_bc._12_4_ = iVar15;
      local_d0._8_8_ = fVar2;
      if (0 < specs->width) {
        if (iVar1 < 1) {
          iVar15 = 1 - iVar1;
        }
        lVar3 = 2;
        if (99 < iVar15) {
          lVar3 = (ulong)(999 < iVar15) + 3;
        }
        sVar7 = uVar11 + (3 - (ulong)(local_ff[0] == '\0')) + lVar3;
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,sVar7,sVar7,(anon_class_40_8_dbbf3351 *)local_d0);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      aVar5 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<double>,_char,_fmt::v10::detail::digit_grouping<char>_>
              ::anon_class_40_8_dbbf3351::operator()
                        ((anon_class_40_8_dbbf3351 *)local_d0,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar9 = 0x10;
      if (0 < iVar16) {
        iVar9 = iVar16;
      }
      if ((iVar1 < -3) || (iVar9 < iVar1)) goto LAB_0010b518;
    }
    local_d4 = iVar1;
    if (iVar15 < 0) {
      if (iVar1 < 1) {
        iVar9 = -iVar1;
        iVar15 = iVar9;
        if (SBORROW4(iVar16,iVar9) != iVar16 + iVar1 < 0) {
          iVar15 = iVar16;
        }
        if (iVar16 < 0) {
          iVar15 = iVar9;
        }
        if (iVar18 != 0) {
          iVar15 = iVar9;
        }
        local_70._M_allocated_capacity._0_4_ = iVar15;
        if (iVar18 == 0 && iVar15 == 0) {
          local_fd._1_1_ = (char)((uVar10 & 0x80000) >> 0x13);
          iVar18 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
        }
        else {
          local_fd._1_1_ = 1;
          iVar18 = 2;
          if (iVar15 < 0) goto LAB_0010b820;
        }
        sVar7 = (ulong)(uint)(iVar18 + iVar15) + uVar11;
        local_d0._0_8_ = local_ff + 1;
        local_d0._8_8_ = local_ff + 2;
        unique0x00004e80 = (long)&local_fd + 1;
        auStack_bc._4_8_ = local_ff;
        auStack_bc._12_8_ = &local_70;
        local_a8 = &local_e0;
        local_a0._M_allocated_capacity = (size_type)&local_ec;
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                          (out,specs,sVar7,sVar7,(anon_class_56_7_162c6e41 *)local_d0);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      iVar15 = 0;
      local_fd._1_4_ = iVar16 - iVar18 & (int)(uVar10 << 0xc) >> 0x1f;
      uVar17 = local_fd._1_4_;
      if ((int)local_fd._1_4_ < 1) {
        uVar17 = 0;
      }
      unique0x10000523 = uVar11;
      local_e8 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_d0,loc,(bool)((byte)(uVar10 >> 0x11) & 1));
      if (local_a8 != (float_specs *)0x0) {
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_d0._0_8_ + (long)(int *)local_d0._8_8_);
        lVar3 = 0;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0._0_8_;
        do {
          if (paVar8 == paVar6) {
            cVar13 = paVar6->_M_local_buf[-1];
            paVar8 = paVar6;
          }
          else {
            cVar13 = paVar8->_M_local_buf[0];
            if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_0010b847;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar8->_M_local_buf + 1);
          }
          iVar15 = iVar15 + cVar13;
          if (iVar1 <= iVar15) goto LAB_0010b847;
          lVar3 = lVar3 + 1;
        } while( true );
      }
      lVar3 = 0;
LAB_0010b847:
      sVar7 = (ulong)uVar17 + stack0xffffffffffffff08 + lVar3 + 1;
      local_70._M_allocated_capacity = (size_type)(local_ff + 1);
      local_70._8_8_ = &local_e0;
      local_60._M_allocated_capacity = (size_type)&local_ec;
      local_60._8_8_ = &local_d4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_ff;
      local_40._M_allocated_capacity = (long)&local_fd + 1;
      local_40._8_8_ = local_ff + 2;
      local_48 = (digit_grouping<char> *)local_d0;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (local_e8.container,specs,sVar7,sVar7,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_bc._12_8_ != &local_a0) {
        operator_delete((void *)auStack_bc._12_8_,(ulong)(local_a0._M_allocated_capacity + 1));
      }
      uVar11 = stack0xffffffffffffff40;
      uVar12 = local_d0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d0 + 0x10)) {
        return (appender)bVar4.container;
      }
    }
    else {
      register0x00000038 = ZEXT48((uint)(iVar15 + (int)uVar11));
      local_fd._1_4_ = iVar16 - iVar1;
      if ((uVar10 >> 0x13 & 1) != 0) {
        register0x00000038 = register0x00000038 + 1;
        if (fspecs._4_1_ == '\x02' || 0 < (int)local_fd._1_4_) {
          if (0 < (int)local_fd._1_4_) {
            register0x00000038 = register0x00000038 + (ulong)(uint)local_fd._1_4_;
          }
        }
        else {
          local_fd._1_4_ = 0;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar10 >> 0x11) & 1));
      iVar18 = 0;
      if (local_48 != (digit_grouping<char> *)0x0) {
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_70._8_8_ + local_70._M_allocated_capacity);
        lVar3 = 0;
        uVar11 = local_70._M_allocated_capacity;
        do {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar11 == paVar8) {
            cVar13 = paVar8->_M_local_buf[-1];
            uVar11 = paVar8;
          }
          else {
            cVar13 = *(char *)uVar11;
            if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_0010b743;
            uVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar11 + 1);
          }
          iVar18 = iVar18 + cVar13;
          if (iVar1 <= iVar18) goto LAB_0010b743;
          lVar3 = lVar3 + 1;
        } while( true );
      }
      lVar3 = 0;
LAB_0010b743:
      local_d0._0_8_ = local_ff + 1;
      local_d0._8_8_ = &local_e0;
      unique0x00004e80 = &local_ec;
      local_a8 = &local_78;
      local_a0._M_allocated_capacity = (size_type)local_ff;
      local_a0._8_8_ = (long)&local_fd + 1;
      local_90 = local_ff + 2;
      auStack_bc._4_8_ = f;
      auStack_bc._12_8_ = &local_70;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,stack0xffffffffffffff08 + lVar3,stack0xffffffffffffff08 + lVar3,
                      (anon_class_72_9_0c6a3a8a *)local_d0);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
      }
      uVar11 = local_60._M_allocated_capacity;
      uVar12 = local_70._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity == &local_60) {
        return (appender)bVar4.container;
      }
    }
    operator_delete((void *)uVar12,uVar11 + 1);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
  }
LAB_0010b820:
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/core.h"
              ,0x189,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}